

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c633::ktxTexture_GetImageOffsetTest_ImageOffsetLevel_Test::TestBody
          (ktxTexture_GetImageOffsetTest_ImageOffsetLevel_Test *this)

{
  bool bVar1;
  undefined4 uVar2;
  int line;
  Message *expected_predicate_value;
  char *pcVar3;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  ktx_size_t offset;
  ktx_size_t imageSize;
  ktx_size_t expectedOffset;
  ktx_error_code_e result;
  ktxTexture *texture;
  TextureWriterTestHelper<unsigned_char,_4U,_32856U> helper;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffc6c;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffc74;
  ktx_error_code_e *in_stack_fffffffffffffc78;
  TextureWriterTestHelper<unsigned_char,_4U,_32856U> *in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffc88;
  ktx_uint32_t in_stack_fffffffffffffc8c;
  char *in_stack_fffffffffffffc90;
  undefined8 in_stack_fffffffffffffc98;
  Type type;
  undefined4 in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca4;
  ktx_uint32_t in_stack_fffffffffffffcb0;
  ktx_uint32_t in_stack_fffffffffffffcb8;
  char *in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffce0;
  AssertionResult *assertion_result;
  AssertHelper *in_stack_fffffffffffffcf0;
  AssertionResult local_300 [2];
  undefined4 local_2e0;
  int local_2dc;
  AssertionResult local_2d8 [2];
  AssertionResult local_2b8 [2];
  undefined4 local_298;
  undefined4 local_294;
  AssertionResult local_290 [2];
  undefined4 local_26c;
  AssertionResult local_268 [2];
  undefined4 local_248;
  undefined4 local_244;
  AssertionResult local_240;
  uint local_22c;
  string local_228 [40];
  undefined8 local_200;
  undefined1 local_1e9;
  AssertionResult local_1e8 [2];
  undefined4 local_1c4;
  AssertionResult local_1c0;
  undefined1 local_1b0 [8];
  ulong local_1a8;
  ulong local_1a0;
  undefined4 local_194;
  long local_190 [3];
  AssertionResult local_178 [11];
  long local_c0;
  undefined1 local_38 [16];
  int local_28;
  int local_24;
  int local_18;
  
  assertion_result = local_178;
  TextureWriterTestHelper<unsigned_char,_4U,_32856U>::TextureWriterTestHelper
            (in_stack_fffffffffffffc80);
  uVar5 = 1;
  uVar4 = 0x10;
  TextureWriterTestHelper<unsigned_char,_4U,_32856U>::resize
            ((TextureWriterTestHelper<unsigned_char,_4U,_32856U> *)
             CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
             (createFlags)((ulong)in_stack_fffffffffffffc98 >> 0x20),
             (ktx_uint32_t)in_stack_fffffffffffffc98,
             (ktx_uint32_t)((ulong)in_stack_fffffffffffffc90 >> 0x20),
             (ktx_uint32_t)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,
             in_stack_fffffffffffffcb0,in_stack_fffffffffffffcb8);
  type = (Type)((ulong)in_stack_fffffffffffffc98 >> 0x20);
  local_190[0] = 0;
  uVar2 = ktxTexture1_Create(local_38,0,local_190);
  local_1c4 = 0;
  local_194 = uVar2;
  testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
             (char *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
             (ktx_error_code_e *)CONCAT44(in_stack_fffffffffffffc74,uVar5));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1c0);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
    in_stack_fffffffffffffcd8 =
         testing::AssertionResult::failure_message((AssertionResult *)0x1445d1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),type,
               in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,(char *)in_stack_fffffffffffffc80
              );
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffcf0,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc74,uVar5));
    testing::Message::~Message((Message *)0x14462e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14469c);
  local_1e9 = local_190[0] != 0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffffc74,uVar5),
             (bool *)CONCAT44(in_stack_fffffffffffffc6c,uVar4),(type *)0x1446c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1e8);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
    expected_predicate_value =
         testing::Message::operator<<
                   ((Message *)CONCAT44(in_stack_fffffffffffffc74,uVar5),
                    (char (*) [28])CONCAT44(in_stack_fffffffffffffc6c,uVar4));
    local_200 = ktxErrorString(local_194);
    testing::Message::operator<<
              ((Message *)CONCAT44(in_stack_fffffffffffffc74,uVar5),
               (char **)CONCAT44(in_stack_fffffffffffffc6c,uVar4));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,(char *)CONCAT44(uVar2,in_stack_fffffffffffffce0),
               in_stack_fffffffffffffcd8,(char *)expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),type,
               in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,(char *)in_stack_fffffffffffffc80
              );
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffcf0,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc74,uVar5));
    std::__cxx11::string::~string(local_228);
    testing::Message::~Message((Message *)0x1447ee);
  }
  local_22c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14489b);
  if (local_22c == 0) {
    local_244 = (**(code **)(*(long *)(local_190[0] + 8) + 8))(local_190[0],0,0,0,local_1b0);
    local_248 = 0;
    testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
               (char *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
               (ktx_error_code_e *)CONCAT44(in_stack_fffffffffffffc74,uVar5));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_240);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
      testing::AssertionResult::failure_message((AssertionResult *)0x14495b);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),type,
                 in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,
                 (char *)in_stack_fffffffffffffc80);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffcf0,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc74,uVar5));
      testing::Message::~Message((Message *)0x1449b8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x144a26);
    local_26c = 0;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
               (char *)in_stack_fffffffffffffc80,(unsigned_long *)in_stack_fffffffffffffc78,
               (uint *)CONCAT44(in_stack_fffffffffffffc74,uVar5));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_268);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
      testing::AssertionResult::failure_message((AssertionResult *)0x144aa4);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),type,
                 in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,
                 (char *)in_stack_fffffffffffffc80);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffcf0,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc74,uVar5));
      testing::Message::~Message((Message *)0x144b01);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x144b72);
    local_1a8 = (ulong)(uint)(local_28 * local_24 * 4);
    local_1a0 = local_1a8;
    uVar2 = (**(code **)(*(long *)(local_190[0] + 8) + 8))(local_190[0],1,0,0,local_1b0);
    local_298 = 0;
    local_294 = uVar2;
    testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
               (char *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
               (ktx_error_code_e *)CONCAT44(in_stack_fffffffffffffc74,uVar5));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_290);
    if (!bVar1) {
      testing::Message::Message((Message *)CONCAT44(uVar2,in_stack_fffffffffffffca0));
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x144c50);
      type = (Type)((ulong)pcVar3 >> 0x20);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(uVar2,in_stack_fffffffffffffca0),type,
                 in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,
                 (char *)in_stack_fffffffffffffc80);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffcf0,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc74,uVar5));
      testing::Message::~Message((Message *)0x144cad);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x144d1b);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
               (char *)in_stack_fffffffffffffc80,(unsigned_long *)in_stack_fffffffffffffc78,
               (unsigned_long *)CONCAT44(in_stack_fffffffffffffc74,uVar5));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2b8);
    if (!bVar1) {
      testing::Message::Message((Message *)CONCAT44(uVar2,in_stack_fffffffffffffca0));
      in_stack_fffffffffffffc90 =
           testing::AssertionResult::failure_message((AssertionResult *)0x144d8e);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(uVar2,in_stack_fffffffffffffca0),type,
                 in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,
                 (char *)in_stack_fffffffffffffc80);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffcf0,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc74,uVar5));
      testing::Message::~Message((Message *)0x144deb);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x144e5c);
    local_1a0 = local_c0 + -4;
    line = (**(code **)(*(long *)(local_190[0] + 8) + 8))(local_190[0],local_18 + -1,0,0,local_1b0);
    local_2e0 = 0;
    local_2dc = line;
    testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
              ((char *)CONCAT44(line,in_stack_fffffffffffffc88),(char *)in_stack_fffffffffffffc80,
               in_stack_fffffffffffffc78,
               (ktx_error_code_e *)CONCAT44(in_stack_fffffffffffffc74,uVar5));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2d8);
    if (!bVar1) {
      testing::Message::Message((Message *)CONCAT44(uVar2,in_stack_fffffffffffffca0));
      in_stack_fffffffffffffc80 =
           (TextureWriterTestHelper<unsigned_char,_4U,_32856U> *)
           testing::AssertionResult::failure_message((AssertionResult *)0x144f26);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(uVar2,in_stack_fffffffffffffca0),type,
                 in_stack_fffffffffffffc90,line,(char *)in_stack_fffffffffffffc80);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffcf0,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc74,uVar5));
      testing::Message::~Message((Message *)0x144f83);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x144ff1);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              ((char *)CONCAT44(line,in_stack_fffffffffffffc88),(char *)in_stack_fffffffffffffc80,
               (unsigned_long *)in_stack_fffffffffffffc78,
               (unsigned_long *)CONCAT44(in_stack_fffffffffffffc74,uVar5));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_300);
    if (!bVar1) {
      testing::Message::Message((Message *)CONCAT44(uVar2,in_stack_fffffffffffffca0));
      testing::AssertionResult::failure_message((AssertionResult *)0x145064);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(uVar2,in_stack_fffffffffffffca0),type,
                 in_stack_fffffffffffffc90,line,(char *)in_stack_fffffffffffffc80);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffcf0,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc74,uVar5));
      testing::Message::~Message((Message *)0x1450c1);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x14512c);
    if (local_190[0] != 0) {
      (*(code *)**(undefined8 **)(local_190[0] + 8))();
    }
    local_22c = 0;
  }
  TextureWriterTestHelper<unsigned_char,_4U,_32856U>::~TextureWriterTestHelper
            ((TextureWriterTestHelper<unsigned_char,_4U,_32856U> *)0x145173);
  return;
}

Assistant:

TEST(ktxTexture_GetImageOffsetTest, ImageOffsetLevel) {
    //using createFlagBits = typename WriterTestHelper<GLubyte, 4, GL_RGBA8>::createFlagBits;
    TextureWriterTestHelper<GLubyte, 4, GL_RGBA8> helper;

    helper.resize(createFlagBits::eMipmapped, 1, 1, 2, 16, 16, 1);
    ktxTexture* texture = 0;
    KTX_error_code result;
    ktx_size_t expectedOffset, imageSize, offset;

    result = ktxTexture1_Create(&helper.createInfo,
                               KTX_TEXTURE_CREATE_NO_STORAGE,
                               (ktxTexture1**)&texture);
    EXPECT_EQ(result, KTX_SUCCESS);
    ASSERT_TRUE(texture != NULL) << "ktxTexture1_Create failed: "
                                 << ktxErrorString(result);
    EXPECT_EQ(ktxTexture_GetImageOffset(texture, 0, 0, 0, &offset),
              KTX_SUCCESS);
    EXPECT_EQ(offset, 0U);
    // GL_RGBA8 is 1 x 4 bytes.
    imageSize = helper.createInfo.baseWidth
                * helper.createInfo.baseHeight * 1 * 4;
    expectedOffset = imageSize;
    EXPECT_EQ(ktxTexture_GetImageOffset(texture, 1, 0, 0, &offset),
              KTX_SUCCESS);
    EXPECT_EQ(offset, expectedOffset);
    // The image used to calculate imageDataSize has the same dimensions and
    // internalformat as those specified by createInfo.
    expectedOffset = helper.imageDataSize - 4;
    EXPECT_EQ(ktxTexture_GetImageOffset(texture, helper.createInfo.numLevels - 1, 0, 0, &offset),
              KTX_SUCCESS);
    EXPECT_EQ(offset, expectedOffset);
    if (texture)
        ktxTexture_Destroy(texture);
}